

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeSetLang(xmlNodePtr cur,xmlChar *lang)

{
  xmlNsPtr ns_00;
  xmlNsPtr ns;
  xmlChar *lang_local;
  xmlNodePtr cur_local;
  
  if ((cur != (xmlNodePtr)0x0) &&
     (((cur->type - XML_ELEMENT_NODE < 2 || (0x11 < cur->type - XML_TEXT_NODE)) &&
      (ns_00 = xmlSearchNsByHref(cur->doc,cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace"),
      ns_00 != (xmlNsPtr)0x0)))) {
    xmlSetNsProp(cur,ns_00,"lang",lang);
  }
  return;
}

Assistant:

void
xmlNodeSetLang(xmlNodePtr cur, const xmlChar *lang) {
    xmlNsPtr ns;

    if (cur == NULL) return;
    switch(cur->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_PI_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    return;
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    break;
    }
    ns = xmlSearchNsByHref(cur->doc, cur, XML_XML_NAMESPACE);
    if (ns == NULL)
	return;
    xmlSetNsProp(cur, ns, BAD_CAST "lang", lang);
}